

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytree.c
# Opt level: O2

tommy_tree_node * tommy_tree_balance(tommy_tree_node *root)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  tommy_tree_node *ptVar5;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = tommy_tree_delta(root);
  if (iVar3 < -1) {
    ptVar5 = root->next;
    iVar3 = tommy_tree_delta(ptVar5);
    if (0 < iVar3) {
      ptVar5 = tommy_tree_rotate_right(ptVar5);
      root->next = ptVar5;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      ptVar5 = tommy_tree_rotate_left(root);
      return ptVar5;
    }
  }
  else if (iVar3 < 2) {
    root->key = 0;
    uVar4 = 0;
    if ((root->prev != (tommy_node_struct *)0x0) && (uVar1 = root->prev->key, uVar1 != 0)) {
      root->key = uVar1;
      uVar4 = uVar1;
    }
    if ((root->next != (tommy_node_struct *)0x0) && (uVar1 = root->next->key, uVar4 < uVar1)) {
      uVar4 = uVar1;
    }
    root->key = uVar4 + 1;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      return root;
    }
  }
  else {
    ptVar5 = root->prev;
    iVar3 = tommy_tree_delta(ptVar5);
    if (iVar3 < 0) {
      ptVar5 = tommy_tree_rotate_left(ptVar5);
      root->prev = ptVar5;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      ptVar5 = tommy_tree_rotate_right(root);
      return ptVar5;
    }
  }
  __stack_chk_fail();
}

Assistant:

static tommy_tree_node* tommy_tree_balance(tommy_tree_node* root)
{
	int delta = tommy_tree_delta(root);

	if (delta < -1) {
		if (tommy_tree_delta(root->next) > 0)
			root->next = tommy_tree_rotate_right(root->next);
		return tommy_tree_rotate_left(root);
	}

	if (delta > 1) {
		if (tommy_tree_delta(root->prev) < 0)
			root->prev = tommy_tree_rotate_left(root->prev);
		return tommy_tree_rotate_right(root);
	}

	/* recompute key */
	root->key = 0;

	if (root->prev && root->prev->key > root->key)
		root->key = root->prev->key;

	if (root->next && root->next->key > root->key)
		root->key = root->next->key;

	/* count itself */
	root->key += 1;

	return root;
}